

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

bool __thiscall snappy::SnappyDecompressor::RefillTag(SnappyDecompressor *this)

{
  char *__dest;
  ulong uVar1;
  int iVar2;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar3;
  long lVar4;
  uint uVar5;
  size_t __n;
  uint uVar6;
  ulong uVar7;
  size_t n;
  ulong local_38;
  byte *__src;
  
  __src = (byte *)this->ip_;
  local_38 = in_RAX;
  if (__src == (byte *)this->ip_limit_) {
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    iVar2 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
    __src = (byte *)CONCAT44(extraout_var,iVar2);
    this->peeked_ = (uint32)local_38;
    this->eof_ = local_38 == 0;
    if (local_38 == 0) {
      return false;
    }
    this->ip_limit_ = (char *)(__src + local_38);
  }
  if (__src < this->ip_limit_) {
    lVar4 = (ulong)(*(ushort *)(internal::char_table + (ulong)*__src * 2) >> 0xb) + 1;
    uVar7 = (long)this->ip_limit_ - (long)__src;
    uVar5 = (uint)uVar7;
    uVar3 = (uint)lVar4;
    if (uVar3 <= uVar5) {
      if (uVar5 < 5) {
        memmove(this->scratch_,__src,(ulong)(uVar5 & 7));
        (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
        this->peeked_ = 0;
        this->ip_ = this->scratch_;
        this->ip_limit_ = this->scratch_ + (uVar5 & 7);
      }
      else {
        this->ip_ = (char *)__src;
      }
      return true;
    }
    __dest = this->scratch_;
    memmove(__dest,__src,uVar7 & 0xffffffff);
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    this->peeked_ = 0;
    do {
      uVar6 = (uint)uVar7;
      uVar5 = uVar3 - uVar6;
      if (uVar3 < uVar6 || uVar5 == 0) {
        if (uVar5 == 0) {
          this->ip_ = __dest;
          this->ip_limit_ = __dest + lVar4;
          return true;
        }
        __assert_fail("nbuf == needed",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/snappy/snappy.cc"
                      ,0x38d,"bool snappy::SnappyDecompressor::RefillTag()");
      }
      iVar2 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
      uVar1 = local_38;
      if (local_38 != 0) {
        __n = (size_t)uVar5;
        if ((uint)local_38 <= uVar5) {
          __n = local_38 & 0xffffffff;
        }
        memcpy(__dest + (uVar7 & 0xffffffff),(void *)CONCAT44(extraout_var_00,iVar2),__n);
        uVar7 = (ulong)(uVar6 + (int)__n);
        (*this->reader_->_vptr_Source[4])(this->reader_,__n);
      }
    } while (uVar1 != 0);
    return false;
  }
  __assert_fail("ip < ip_limit_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/snappy/snappy.cc"
                ,0x374,"bool snappy::SnappyDecompressor::RefillTag()");
}

Assistant:

bool SnappyDecompressor::RefillTag() {
  const char* ip = ip_;
  if (ip == ip_limit_) {
    // Fetch a new fragment from the reader
    reader_->Skip(peeked_);   // All peeked bytes are used up
    size_t n;
    ip = reader_->Peek(&n);
    peeked_ = n;
    eof_ = (n == 0);
    if (eof_) return false;
    ip_limit_ = ip + n;
  }

  // Read the tag character
  assert(ip < ip_limit_);
  const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip));
  const uint32 entry = char_table[c];
  const uint32 needed = (entry >> 11) + 1;  // +1 byte for 'c'
  assert(needed <= sizeof(scratch_));

  // Read more bytes from reader if needed
  uint32 nbuf = ip_limit_ - ip;
  if (nbuf < needed) {
    // Stitch together bytes from ip and reader to form the word
    // contents.  We store the needed bytes in "scratch_".  They
    // will be consumed immediately by the caller since we do not
    // read more than we need.
    memmove(scratch_, ip, nbuf);
    reader_->Skip(peeked_);  // All peeked bytes are used up
    peeked_ = 0;
    while (nbuf < needed) {
      size_t length;
      const char* src = reader_->Peek(&length);
      if (length == 0) return false;
      uint32 to_add = std::min<uint32>(needed - nbuf, length);
      memcpy(scratch_ + nbuf, src, to_add);
      nbuf += to_add;
      reader_->Skip(to_add);
    }
    assert(nbuf == needed);
    ip_ = scratch_;
    ip_limit_ = scratch_ + needed;
  } else if (nbuf < kMaximumTagLength) {
    // Have enough bytes, but move into scratch_ so that we do not
    // read past end of input
    memmove(scratch_, ip, nbuf);
    reader_->Skip(peeked_);  // All peeked bytes are used up
    peeked_ = 0;
    ip_ = scratch_;
    ip_limit_ = scratch_ + nbuf;
  } else {
    // Pass pointer to buffer returned by reader_.
    ip_ = ip;
  }
  return true;
}